

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

Span * __thiscall tcmalloc::PageHeap::CheckAndHandlePreMerge(PageHeap *this,Span *span,Span *other)

{
  bool bVar1;
  
  if (other == (Span *)0x0) {
LAB_0011f973:
    other = (Span *)0x0;
  }
  else {
    if ((((*(uint *)&other->field_0x28 & 0x3000000) == 0x1000000 & this->aggressive_decommit_) == 1)
       && ((*(uint *)&span->field_0x28 & 0x3000000) == 0x2000000)) {
      bVar1 = DecommitSpan(this,other);
      if (!bVar1) goto LAB_0011f973;
    }
    else if (((*(uint *)&other->field_0x28 ^ *(uint *)&span->field_0x28) & 0x3000000) != 0)
    goto LAB_0011f973;
    RemoveFromFreeList(this,other);
  }
  return other;
}

Assistant:

Span* PageHeap::CheckAndHandlePreMerge(Span* span, Span* other) {
  if (other == nullptr) {
    return other;
  }
  // if we're in aggressive decommit mode and span is decommitted,
  // then we try to decommit adjacent span.
  if (aggressive_decommit_ && other->location == Span::ON_NORMAL_FREELIST
      && span->location == Span::ON_RETURNED_FREELIST) {
    bool worked = DecommitSpan(other);
    if (!worked) {
      return nullptr;
    }
  } else if (other->location != span->location) {
    return nullptr;
  }

  RemoveFromFreeList(other);
  return other;
}